

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreciseDeltaTests.cpp
# Opt level: O1

void __thiscall
agge::tests::PreciseDeltaTests::PositiveFractionalDeltaDoesNotOverflow(PreciseDeltaTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  FailedAssertion *pFVar4;
  uint uVar5;
  int iVar6;
  string local_98;
  string local_78;
  LocationInfo local_58;
  
  iVar6 = 0;
  iVar3 = -0x630000;
  uVar5 = 0;
  do {
    iVar6 = iVar6 + (uVar5 + 0x3f5a00 >> 0x1e);
    uVar5 = uVar5 + 0x3f5a00 & 0x3fffffff;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0);
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0x25);
  if (1 < iVar6 - 0x61ffU) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Value is not \'true\'!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_78,&local_58);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_58.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  iVar6 = 0;
  iVar3 = -0x630000;
  uVar5 = 0;
  do {
    iVar6 = iVar6 + (uVar5 + 0x3f5a00 >> 0x1e);
    uVar5 = uVar5 + 0x3f5a00 & 0x3fffffff;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0);
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0x34);
  if (iVar6 - 0x61ffU < 2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    return;
  }
  pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Value is not \'true\'!","");
  ut::FailedAssertion::FailedAssertion(pFVar4,&local_78,&local_58);
  __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( PositiveFractionalDeltaDoesNotOverflow )
			{
				// INIT
				precise_delta d1(98, 99 * 0x10000);
				int sum = 0;

				// ACT
				d1.multiply(256);

				// ACT / ASSERT
				for (int i = 99 * 0x10000; i; --i)
					sum += d1.next();

				// ASSERT
				assert_is_true(98 * 256 - 1 <= sum && sum <= 98 * 256);

				// INIT
				precise_delta d2(-98, 99 * 0x10000);

				sum = 0;

				// ACT
				d2.multiply(-256);

				// ACT / ASSERT
				for (int i = 99 * 0x10000; i; --i)
					sum += d2.next();

				// ASSERT
				assert_is_true(98 * 256 - 1 <= sum && sum <= 98 * 256);
			}